

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O0

void __thiscall KDIS::KException::~KException(KException *this)

{
  KException *this_local;
  
  *(undefined ***)this = &PTR__KException_004f11b8;
  std::__cxx11::string::~string((string *)&this->m_sErrorText);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~KException() throw()
    {
    }